

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcManager.cpp
# Opt level: O0

GrcEnv * __thiscall GrcManager::PushPassEnv(GrcManager *this,GrpLineAndFile *lnf,int nPass)

{
  bool bVar1;
  int in_EDX;
  GrcSymbolTableEntry *in_RDI;
  pair<GrcSymbolTableEntry_*,_int> hmpair;
  Symbol psymTable;
  GrcEnv *penvNew;
  undefined8 in_stack_ffffffffffffff50;
  map<GrcSymbolTableEntry_*,_int,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_int>_>_>
  *in_stack_ffffffffffffff60;
  GrcManager *in_stack_ffffffffffffff70;
  string local_88 [16];
  GrpLineAndFile *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  GrcSymbolTableEntry *in_stack_ffffffffffffff98;
  GdlObject *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  GrcErrorList *in_stack_ffffffffffffffb0;
  pair<GrcSymbolTableEntry_*,_int> local_38;
  Symbol local_28;
  GrcEnv *local_20;
  int local_14;
  
  local_14 = in_EDX;
  local_20 = PushEnvAux(in_stack_ffffffffffffff70);
  GrcEnv::SetPass(local_20,local_14);
  local_28 = GrcEnv::Table(local_20);
  std::pair<GrcSymbolTableEntry_*,_int>::pair<GrcSymbolTableEntry_*,_int,_true>(&local_38);
  local_38.first = local_28;
  local_38.second = local_14;
  std::
  map<GrcSymbolTableEntry*,int,std::less<GrcSymbolTableEntry*>,std::allocator<std::pair<GrcSymbolTableEntry*const,int>>>
  ::insert<std::pair<GrcSymbolTableEntry*,int>&>
            (in_stack_ffffffffffffff60,(pair<GrcSymbolTableEntry_*,_int> *)in_RDI);
  bVar1 = GrcSymbolTableEntry::FitsSymbolType
                    (in_RDI,(SymbolType)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  if (!bVar1) {
    GrcSymbolTableEntry::FullName_abi_cxx11_(in_stack_ffffffffffffff98);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88," table cannot hold passes",(allocator *)&stack0xffffffffffffff77);
    GrcErrorList::AddError
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
               &in_stack_ffffffffffffff98->m_staFieldName,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  return local_20;
}

Assistant:

GrcEnv * GrcManager::PushPassEnv(GrpLineAndFile & lnf, int nPass)
{
	GrcEnv * penvNew = PushEnvAux();

	penvNew->SetPass(nPass);

	Symbol psymTable = penvNew->Table();

	std::pair<Symbol, int> hmpair;
	hmpair.first = psymTable;
	hmpair.second = nPass;
	m_hmpsymnCurrPass.insert(hmpair);
	//m_hmpsymnCurrPass.Insert(psymTable, nPass, true);

	if (!psymTable->FitsSymbolType(ksymtTableRule))
	{
		g_errorList.AddError(1182, NULL,
			psymTable->FullName(),
			" table cannot hold passes",
			lnf);
	}

	return penvNew;
}